

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,4,1,0,4,1>,Eigen::CwiseNullaryOp<C_A_T_C_H_T_E_S_T_0()::__0,Eigen::Matrix<double,4,1,0,4,1>>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,_4,_1,_0,_4,_1> *dst,
               CwiseNullaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_tests_point_source_panner_tests_cpp:35:17),_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
               *src,assign_op<double,_double> *func)

{
  undefined8 func_00;
  Matrix<double,_4,_1,_0,_4,_1> *dstExpr;
  undefined1 local_70 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_38 [8];
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> *func_local;
  CwiseNullaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_tests_point_source_panner_tests_cpp:35:17),_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
  *src_local;
  Matrix<double,_4,_1,_0,_4,_1> *dst_local;
  
  srcEvaluator._16_8_ = func;
  evaluator<Eigen::CwiseNullaryOp<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/tests/point_source_panner_tests.cpp:35:17),_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  ::evaluator((evaluator<Eigen::CwiseNullaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_tests_point_source_panner_tests_cpp:35:17),_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
               *)local_38,src);
  resize_if_allowed<Eigen::Matrix<double,4,1,0,4,1>,Eigen::CwiseNullaryOp<C_A_T_C_H_T_E_S_T_0()::__0,Eigen::Matrix<double,4,1,0,4,1>>,double,double>
            (dst,src,(assign_op<double,_double> *)srcEvaluator._16_8_);
  evaluator<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::evaluator
            ((evaluator<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator._16_8_;
  dstExpr = EigenBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::const_cast_derived
                      ((EigenBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/tests/point_source_panner_tests.cpp:35:17),_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_tests_point_source_panner_tests_cpp:35:17),_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
              *)local_70,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_38,
             (assign_op<double,_double> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/tests/point_source_panner_tests.cpp:35:17),_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_1,_2>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_tests_point_source_panner_tests_cpp:35:17),_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_70);
  evaluator<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::~evaluator
            ((evaluator<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&kernel.m_dstExpr);
  evaluator<Eigen::CwiseNullaryOp<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/tests/point_source_panner_tests.cpp:35:17),_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  ::~evaluator((evaluator<Eigen::CwiseNullaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_tests_point_source_panner_tests_cpp:35:17),_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                *)local_38);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}